

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

void __thiscall CVmFormatter::set_charmap(CVmFormatter *this,CCharmapToLocal *cmap)

{
  CCharmap *in_RSI;
  long in_RDI;
  
  if (in_RSI != (CCharmap *)0x0) {
    CCharmap::add_ref(in_RSI);
  }
  if (*(long *)(in_RDI + 0x10) != 0) {
    CCharmap::release_ref(in_RSI);
  }
  *(CCharmap **)(in_RDI + 0x10) = in_RSI;
  return;
}

Assistant:

void CVmFormatter::set_charmap(CCharmapToLocal *cmap)
{
    /* add a reference to the new mapper, if we have one */
    if (cmap != 0)
        cmap->add_ref();

    /* release our reference on any old mapper */
    if (cmap_ != 0)
        cmap_->release_ref();

    /* remember the new mapper */
    cmap_ = cmap;
}